

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O3

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  return CS_ERR_OK;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	if (type == CS_OPT_MODE) {
		if (value & CS_MODE_32)
			handle->disasm = Mips_getInstruction;
		else
			handle->disasm = Mips64_getInstruction;

		handle->mode = (cs_mode)value;
	}
	return CS_ERR_OK;
}